

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::Texture3DFilteringCase::init
          (Texture3DFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  *this_00;
  uint depth;
  pointer pPVar1;
  uint uVar2;
  uint uVar3;
  int extraout_EAX;
  Texture3D *pTVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  deUint32 step;
  Vec4 gMin;
  Vec4 gMax;
  Vector<float,_4> res_3;
  TextureFormat texFmt;
  TextureFormatInfo fmtInfo;
  RGBA local_130;
  RGBA local_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [8];
  float afStack_f0 [6];
  Vec4 local_d8;
  ulong local_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  Vec4 local_98;
  TextureFormat local_80;
  TextureFormatInfo local_78;
  
  local_80 = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo(&local_78,&local_80);
  uVar6 = this->m_width;
  uVar9 = this->m_height;
  uVar3 = uVar9;
  if ((int)uVar9 < (int)uVar6) {
    uVar3 = uVar6;
  }
  depth = this->m_depth;
  if ((int)uVar3 <= (int)depth) {
    uVar3 = depth;
  }
  local_128 = 4.48416e-44;
  if (uVar3 != 0) {
    uVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    local_128 = (float)(uVar2 ^ 0x1f);
  }
  local_108 = local_78.valueMin.m_data[0];
  fStack_104 = local_78.valueMin.m_data[1];
  fStack_100 = local_78.valueMin.m_data[2];
  fStack_fc = local_78.valueMin.m_data[3];
  local_118 = local_78.valueMax.m_data[0];
  fStack_114 = local_78.valueMax.m_data[1];
  fStack_110 = local_78.valueMax.m_data[2];
  fStack_10c = local_78.valueMax.m_data[3];
  pTVar4 = (Texture3D *)operator_new(0x70);
  glu::Texture3D::Texture3D
            (pTVar4,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,uVar6,
             uVar9,depth);
  this->m_gradientTex = pTVar4;
  pTVar4 = (Texture3D *)operator_new(0x70);
  glu::Texture3D::Texture3D
            (pTVar4,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,
             this->m_width,this->m_height,this->m_depth);
  this->m_gridTex = pTVar4;
  if (uVar3 != 0) {
    uVar6 = 0x1f - (int)local_128;
    local_c0 = (ulong)uVar6;
    uVar9 = 0x20 - (int)local_128;
    lVar8 = 0;
    uVar5 = 0;
    if (0 < (int)uVar6) {
      uVar5 = (ulong)uVar6;
    }
    local_118 = local_118 - local_108;
    fStack_114 = fStack_114 - fStack_104;
    fStack_110 = fStack_110 - fStack_100;
    fStack_10c = fStack_10c - fStack_fc;
    local_128 = local_118 * 0.0 + local_108;
    fStack_124 = fStack_114 * 0.0 + fStack_104;
    fStack_120 = fStack_110 * 0.0 + fStack_100;
    fStack_11c = fStack_10c * 1.0 + fStack_fc;
    local_b8 = local_118 * 1.0 + local_108;
    fStack_b4 = fStack_114 * 1.0 + fStack_104;
    fStack_b0 = fStack_110 * 1.0 + fStack_100;
    fStack_ac = fStack_10c * 0.0 + fStack_fc;
    iVar7 = 0;
    do {
      local_f8 = (undefined1  [8])CONCAT44(fStack_124,local_128);
      afStack_f0[1] = fStack_11c;
      afStack_f0[0] = fStack_120;
      local_d8.m_data[1] = fStack_b4;
      local_d8.m_data[0] = local_b8;
      local_d8.m_data[3] = fStack_ac;
      local_d8.m_data[2] = fStack_b0;
      tcu::Texture3D::allocLevel(&this->m_gradientTex->m_refTexture,iVar7);
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)
                 ((long)(((this->m_gradientTex->m_refTexture).super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                        m_size.m_data + lVar8 + -8),(Vec4 *)local_f8,&local_d8);
      iVar7 = iVar7 + 1;
      lVar8 = lVar8 + 0x28;
    } while (uVar5 * 0x28 + 0x28 != lVar8);
    if (uVar3 != 0) {
      uVar10 = 0;
      local_128 = (float)(0xffffff / (ulong)uVar9);
      uVar5 = local_c0 & 0xffffffff;
      if ((int)local_c0 < 1) {
        uVar5 = uVar10;
      }
      iVar7 = 0;
      do {
        tcu::Texture3D::allocLevel(&this->m_gridTex->m_refTexture,iVar7);
        uVar6 = (int)local_128 * iVar7;
        local_12c.m_value = uVar6 | 0xff000000;
        pPVar1 = (this->m_gridTex->m_refTexture).super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tcu::RGBA::toVec(&local_12c);
        local_130.m_value = ~uVar6 | 0xff000000;
        local_f8._4_4_ = local_d8.m_data[1] * fStack_114 + fStack_104;
        local_f8._0_4_ = local_d8.m_data[0] * local_118 + local_108;
        afStack_f0[1] = local_d8.m_data[3] * fStack_10c + fStack_fc;
        afStack_f0[0] = local_d8.m_data[2] * fStack_110 + fStack_100;
        tcu::RGBA::toVec(&local_130);
        local_98.m_data[0] = local_a8 * local_118 + local_108;
        local_98.m_data[1] = fStack_a4 * fStack_114 + fStack_104;
        local_98.m_data[2] = fStack_a0 * fStack_110 + fStack_100;
        local_98.m_data[3] = fStack_9c * fStack_10c + fStack_fc;
        tcu::fillWithGrid((PixelBufferAccess *)
                          ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + uVar10 + -8)
                          ,4,(Vec4 *)local_f8,&local_98);
        iVar7 = iVar7 + 1;
        uVar10 = uVar10 + 0x28;
      } while (uVar5 * 0x28 + 0x28 != uVar10);
    }
  }
  glu::Texture3D::upload(this->m_gradientTex);
  glu::Texture3D::upload(this->m_gridTex);
  local_f8 = (undefined1  [8])this->m_gradientTex;
  afStack_f0[0] = 1.5;
  afStack_f0[1] = 2.8;
  afStack_f0[2] = 1.0;
  afStack_f0[3] = -1.0;
  afStack_f0[4] = -2.7;
  afStack_f0[5] = -2.275;
  this_00 = &this->m_cases;
  std::
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>
            (this_00,(FilterCase *)local_f8);
  local_f8 = (undefined1  [8])this->m_gradientTex;
  afStack_f0[0] = -2.0;
  afStack_f0[1] = -1.5;
  afStack_f0[2] = -1.8;
  afStack_f0[3] = -0.1;
  afStack_f0[4] = 0.9;
  afStack_f0[5] = -0.25;
  std::
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>
            (this_00,(FilterCase *)local_f8);
  local_f8 = (undefined1  [8])this->m_gridTex;
  afStack_f0[0] = 0.2;
  afStack_f0[1] = 0.175;
  afStack_f0[2] = 0.3;
  afStack_f0[3] = -2.0;
  afStack_f0[4] = -3.7;
  afStack_f0[5] = -1.825;
  std::
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>
            (this_00,(FilterCase *)local_f8);
  local_f8 = (undefined1  [8])this->m_gridTex;
  afStack_f0[0] = -0.8;
  afStack_f0[1] = -2.3;
  afStack_f0[2] = -2.5;
  afStack_f0[3] = 0.2;
  afStack_f0[4] = -0.1;
  afStack_f0[5] = 1.325;
  std::
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>
            (this_00,(FilterCase *)local_f8);
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void Texture3DFilteringCase::init (void)
{
	try
	{
		const tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(m_internalFormat);
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
		const tcu::Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;
		const tcu::Vec4					cBias		= fmtInfo.valueMin;
		const int						numLevels	= deLog2Floor32(de::max(de::max(m_width, m_height), m_depth)) + 1;

		// Create textures.
		m_gradientTex	= new glu::Texture3D(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_depth);
		m_gridTex		= new glu::Texture3D(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_depth);

		// Fill first gradient texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			tcu::Vec4 gMin = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			tcu::Vec4 gMax = tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f)*cScale + cBias;

			m_gradientTex->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(m_gradientTex->getRefTexture().getLevel(levelNdx), gMin, gMax);
		}

		// Fill second with grid texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step	= 0x00ffffff / numLevels;
			deUint32	rgb		= step*levelNdx;
			deUint32	colorA	= 0xff000000 | rgb;
			deUint32	colorB	= 0xff000000 | ~rgb;

			m_gridTex->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithGrid(m_gridTex->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
		}

		// Upload.
		m_gradientTex->upload();
		m_gridTex->upload();

		// Test cases
		m_cases.push_back(FilterCase(m_gradientTex,	tcu::Vec3(1.5f, 2.8f, 1.0f),	tcu::Vec3(-1.0f, -2.7f, -2.275f)));
		m_cases.push_back(FilterCase(m_gradientTex,	tcu::Vec3(-2.0f, -1.5f, -1.8f),	tcu::Vec3(-0.1f, 0.9f, -0.25f)));
		m_cases.push_back(FilterCase(m_gridTex,		tcu::Vec3(0.2f, 0.175f, 0.3f),	tcu::Vec3(-2.0f, -3.7f, -1.825f)));
		m_cases.push_back(FilterCase(m_gridTex,		tcu::Vec3(-0.8f, -2.3f, -2.5f),	tcu::Vec3(0.2f, -0.1f, 1.325f)));

		m_caseNdx = 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Clean up to save memory.
		Texture3DFilteringCase::deinit();
		throw;
	}
}